

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O1

void pstore::command_line::details::report_unknown_option<std::ostream>
               (string *program_name,string *arg_name,string *value,
               basic_ostream<char,_std::char_traits<char>_> *errs)

{
  pointer pcVar1;
  ostream *poVar2;
  options_container *all_options;
  option **ppoVar3;
  string *psVar4;
  size_t sVar5;
  char *pcVar6;
  maybe<pstore::command_line::option_*,_void> best_option;
  string nearest_string;
  maybe<pstore::command_line::option_*,_void> local_78;
  string local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (errs,(program_name->_M_dataplus)._M_p,program_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,": Unknown command line argument \'",0x21);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(arg_name->_M_dataplus)._M_p,arg_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
  all_options = option::all_abi_cxx11_();
  lookup_nearest_option(&local_78,arg_name,all_options);
  if (local_78.valid_ == true) {
    ppoVar3 = maybe<pstore::command_line::option_*,_void>::operator->(&local_78);
    psVar4 = option::name_abi_cxx11_(*ppoVar3);
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + psVar4->_M_string_length);
    sVar5 = utf::length(&local_68);
    pcVar6 = "--";
    if (sVar5 < 2) {
      pcVar6 = "-";
    }
    if (value->_M_string_length != 0) {
      std::__cxx11::string::push_back((char)&local_68);
      std::__cxx11::string::_M_append((char *)&local_68,(ulong)(value->_M_dataplus)._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>(errs,"Did you mean \'",0xe);
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,pcVar6,pcVar6 + (2 - (ulong)(sVar5 < 2)));
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(errs,(char *)local_48,local_40);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'?\n",3);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void report_unknown_option (std::string const & program_name,
                                        std::string const & arg_name, std::string const & value,
                                        ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                errs << str::out_string (program_name)
                     << str::out_text (": Unknown command line argument '")
                     << str::out_string (arg_name) << str::out_text ("'\n");

                if (maybe<option *> const best_option =
                        lookup_nearest_option (arg_name, option::all ())) {
                    std::string nearest_string = (*best_option)->name ();
                    gsl::czstring const dashes = utf::length (nearest_string) < 2U ? "-" : "--";
                    if (!value.empty ()) {
                        nearest_string += '=';
                        nearest_string += value;
                    }
                    errs << str::out_text ("Did you mean '") << str::out_string (dashes)
                         << str::out_string (nearest_string) << str::out_text ("'?\n");
                }
            }